

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O1

void clear_suite::clear_full(void)

{
  reference piVar1;
  int array [4];
  circular_view<int,_18446744073709551615UL> span;
  size_type local_78;
  undefined4 local_6c;
  type local_68 [6];
  circular_view<int,_18446744073709551615UL> local_50;
  
  local_50.member.data = local_68;
  local_68[0] = 0;
  local_68[1] = 0;
  local_68[2] = 0;
  local_68[3] = 0;
  local_50.member.cap = 4;
  local_50.member.size = 0;
  local_50.member.next = 4;
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_50,1);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::back(&local_50);
  *piVar1 = 1;
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_50,1);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::back(&local_50);
  *piVar1 = 2;
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_50,1);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::back(&local_50);
  *piVar1 = 3;
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_50,1);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::back(&local_50);
  *piVar1 = 4;
  local_78 = local_50.member.cap;
  local_6c = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.capacity()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9a2,"void clear_suite::clear_full()",&local_78,&local_6c);
  local_78 = local_50.member.size;
  local_6c = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9a3,"void clear_suite::clear_full()",&local_78,&local_6c);
  local_50.member.size = 0;
  local_50.member.next = local_50.member.cap;
  local_78 = local_50.member.cap;
  local_6c = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.capacity()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9a5,"void clear_suite::clear_full()",&local_78,&local_6c);
  local_78 = local_50.member.size;
  local_6c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9a6,"void clear_suite::clear_full()",&local_78,&local_6c);
  return;
}

Assistant:

void clear_full()
{
    int array[4] = {};
    circular_view<int> span(array);
    span.push_back(1);
    span.push_back(2);
    span.push_back(3);
    span.push_back(4);
    BOOST_TEST_EQ(span.capacity(), 4);
    BOOST_TEST_EQ(span.size(), 4);
    span.clear();
    BOOST_TEST_EQ(span.capacity(), 4);
    BOOST_TEST_EQ(span.size(), 0);
}